

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_get.cpp
# Opt level: O0

int64_t __thiscall UniValue::get_int64(UniValue *this)

{
  bool bVar1;
  runtime_error *prVar2;
  string *str;
  int64_t local_28;
  int64_t retval;
  UniValue *local_10;
  UniValue *this_local;
  
  local_10 = this;
  if (this->typ != VNUM) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"JSON value is not an integer as expected");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  str = getValStr_abi_cxx11_(this);
  bVar1 = anon_unknown.dwarf_463c67::ParseInt64(str,&local_28);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"JSON integer out of range");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_28;
}

Assistant:

int64_t UniValue::get_int64() const
{
    if (typ != VNUM)
        throw std::runtime_error("JSON value is not an integer as expected");
    int64_t retval;
    if (!ParseInt64(getValStr(), &retval))
        throw std::runtime_error("JSON integer out of range");
    return retval;
}